

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O1

btBroadphasePair * __thiscall
btSortedOverlappingPairCache::addOverlappingPair
          (btSortedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  btOverlapFilterCallback *pbVar5;
  btBroadphasePair *pbVar6;
  btOverlappingPairCallback *pbVar7;
  undefined8 uVar8;
  btBroadphaseProxy *pbVar9;
  int iVar10;
  btBroadphasePair *pbVar11;
  long lVar12;
  long lVar13;
  btBroadphaseProxy *pbVar14;
  int iVar15;
  char cVar16;
  
  pbVar5 = this->m_overlapFilterCallback;
  if (pbVar5 == (btOverlapFilterCallback *)0x0) {
    if ((ushort)(proxy0->m_collisionFilterGroup & proxy1->m_collisionFilterMask) == 0) {
      return (btBroadphasePair *)0x0;
    }
    cVar16 = (ushort)(proxy1->m_collisionFilterGroup & proxy0->m_collisionFilterMask) != 0;
  }
  else {
    iVar10 = (*pbVar5->_vptr_btOverlapFilterCallback[2])(pbVar5,proxy0,proxy1);
    cVar16 = (char)iVar10;
  }
  if (cVar16 == '\0') {
    return (btBroadphasePair *)0x0;
  }
  iVar10 = (this->m_overlappingPairArray).m_size;
  iVar4 = (this->m_overlappingPairArray).m_capacity;
  if (iVar10 == iVar4) {
    iVar15 = 1;
    if (iVar10 != 0) {
      iVar15 = iVar10 * 2;
    }
    if (iVar4 < iVar15) {
      if (iVar15 == 0) {
        pbVar11 = (btBroadphasePair *)0x0;
      }
      else {
        pbVar11 = (btBroadphasePair *)btAlignedAllocInternal((long)iVar15 << 5,0x10);
      }
      lVar12 = (long)(this->m_overlappingPairArray).m_size;
      if (0 < lVar12) {
        lVar13 = 0;
        do {
          pbVar6 = (this->m_overlappingPairArray).m_data;
          puVar2 = (undefined8 *)((long)&pbVar6->m_pProxy0 + lVar13);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)((long)&pbVar11->m_pProxy0 + lVar13);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          *(undefined8 *)((long)&pbVar11->m_algorithm + lVar13) =
               *(undefined8 *)((long)&pbVar6->m_algorithm + lVar13);
          *(undefined8 *)((long)&pbVar11->field_3 + lVar13) =
               *(undefined8 *)((long)&pbVar6->field_3 + lVar13);
          lVar13 = lVar13 + 0x20;
        } while (lVar12 * 0x20 != lVar13);
      }
      pbVar6 = (this->m_overlappingPairArray).m_data;
      if (pbVar6 != (btBroadphasePair *)0x0) {
        if ((this->m_overlappingPairArray).m_ownsMemory == true) {
          btAlignedFreeInternal(pbVar6);
        }
        (this->m_overlappingPairArray).m_data = (btBroadphasePair *)0x0;
      }
      (this->m_overlappingPairArray).m_ownsMemory = true;
      (this->m_overlappingPairArray).m_data = pbVar11;
      (this->m_overlappingPairArray).m_capacity = iVar15;
    }
  }
  piVar1 = &(this->m_overlappingPairArray).m_size;
  *piVar1 = *piVar1 + 1;
  pbVar14 = proxy0;
  pbVar9 = proxy1;
  if (proxy0->m_uniqueId < proxy1->m_uniqueId) {
    pbVar14 = proxy1;
    pbVar9 = proxy0;
  }
  pbVar11 = (this->m_overlappingPairArray).m_data;
  pbVar11[iVar10].m_pProxy0 = pbVar9;
  pbVar11[iVar10].m_pProxy1 = pbVar14;
  pbVar11[iVar10].m_algorithm = (btCollisionAlgorithm *)0x0;
  ((anon_union_8_2_ea5a2114_for_btBroadphasePair_3 *)(&pbVar11[iVar10].m_algorithm + 1))->
  m_internalInfo1 = (void *)0x0;
  gOverlappingPairs = gOverlappingPairs + 1;
  gAddedPairs = gAddedPairs + 1;
  pbVar7 = this->m_ghostPairCallback;
  if (pbVar7 != (btOverlappingPairCallback *)0x0) {
    (*pbVar7->_vptr_btOverlappingPairCallback[2])(pbVar7,proxy0,proxy1);
    return pbVar11 + iVar10;
  }
  return pbVar11 + iVar10;
}

Assistant:

btBroadphasePair*	btSortedOverlappingPairCache::addOverlappingPair(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1)
{
	//don't add overlap with own
	btAssert(proxy0 != proxy1);

	if (!needsBroadphaseCollision(proxy0,proxy1))
		return 0;
	
	void* mem = &m_overlappingPairArray.expandNonInitializing();
	btBroadphasePair* pair = new (mem) btBroadphasePair(*proxy0,*proxy1);
	
	gOverlappingPairs++;
	gAddedPairs++;
	
	if (m_ghostPairCallback)
		m_ghostPairCallback->addOverlappingPair(proxy0, proxy1);
	return pair;
	
}